

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  StkId pTVar1;
  Proto *p_00;
  uint uVar2;
  int iVar3;
  CallInfo *local_88;
  CallInfo *local_80;
  ptrdiff_t t___2;
  ptrdiff_t t___1;
  int fsize;
  int n_1;
  Proto *p;
  StkId base;
  ptrdiff_t t__;
  int n;
  CallInfo *ci;
  lua_CFunction f;
  StkId pTStack_20;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  uVar2 = func->tt_ & 0x3f;
  pTStack_20 = func;
  if (uVar2 == 6) {
    p_00 = *(Proto **)((func->value_).f + 0x18);
    t___1._4_4_ = (int)((long)L->top - (long)func >> 4) + -1;
    uVar2 = (uint)p_00->maxstacksize;
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(int)uVar2) {
      pTVar1 = L->stack;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,uVar2);
      pTStack_20 = (StkId)((long)L->stack + ((long)func - (long)pTVar1));
    }
    if (p_00->is_vararg == '\0') {
      for (; t___1._4_4_ < (int)(uint)p_00->numparams; t___1._4_4_ = t___1._4_4_ + 1) {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pTVar1->tt_ = 0;
      }
      p = (Proto *)(pTStack_20 + 1);
    }
    else {
      p = (Proto *)adjust_varargs(L,p_00,t___1._4_4_);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_88 = luaE_extendCI(L);
    }
    else {
      local_88 = L->ci->next;
    }
    L->ci = local_88;
    local_88->nresults = (short)nresults;
    local_88->func = pTStack_20;
    (local_88->u).l.base = (StkId)p;
    local_88->top = (StkId)(&p->next + (long)(int)uVar2 * 2);
    L->top = (StkId)(&p->next + (long)(int)uVar2 * 2);
    (local_88->u).l.savedpc = p_00->code;
    local_88->callstatus = 2;
    if ((L->hookmask & 1U) != 0) {
      callhook(L,local_88);
    }
    L_local._4_4_ = 0;
  }
  else {
    if (uVar2 == 0x16) {
      ci = (CallInfo *)(func->value_).gc;
    }
    else {
      if (uVar2 != 0x26) {
        if ((long)L->stack_last - (long)L->top >> 4 < 2) {
          pTVar1 = L->stack;
          if (0 < L->l_G->GCdebt) {
            luaC_step(L);
          }
          luaD_growstack(L,1);
          pTStack_20 = (StkId)((long)L->stack + ((long)func - (long)pTVar1));
        }
        tryfuncTM(L,pTStack_20);
        iVar3 = luaD_precall(L,pTStack_20,nresults);
        return iVar3;
      }
      ci = *(CallInfo **)((func->value_).f + 0x18);
    }
    if ((long)L->stack_last - (long)L->top >> 4 < 0x15) {
      pTVar1 = L->stack;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,0x14);
      pTStack_20 = (StkId)((long)L->stack + ((long)func - (long)pTVar1));
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_80 = luaE_extendCI(L);
    }
    else {
      local_80 = L->ci->next;
    }
    L->ci = local_80;
    local_80->nresults = (short)nresults;
    local_80->func = pTStack_20;
    local_80->top = L->top + 0x14;
    local_80->callstatus = 0;
    if ((L->hookmask & 1U) != 0) {
      luaD_hook(L,0,-1);
    }
    iVar3 = (*(code *)ci)(L);
    luaD_poscall(L,local_80,L->top + -(long)iVar3,iVar3);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}